

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall re2::DFA::DFA(DFA *this,Prog *prog,MatchKind kind,int64_t max_mem)

{
  int n;
  Prog *pPVar1;
  long lVar2;
  Workq *pWVar3;
  int maxmark;
  int len;
  __uniq_ptr_impl<int,_re2::PODArray<int>::Deleter> local_40;
  
  this->prog_ = prog;
  this->kind_ = kind;
  this->init_failed_ = false;
  Mutex::Mutex(&this->mutex_);
  *(undefined8 *)
   &(this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
    super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> = 0;
  (this->stack_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  this->q0_ = (Workq *)0x0;
  this->q1_ = (Workq *)0x0;
  Mutex::Mutex(&this->cache_mutex_);
  this->mem_budget_ = max_mem;
  (this->state_cache_)._M_h._M_buckets = &(this->state_cache_)._M_h._M_single_bucket;
  (this->state_cache_)._M_h._M_bucket_count = 1;
  (this->state_cache_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->state_cache_)._M_h._M_element_count = 0;
  (this->state_cache_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->state_cache_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->state_cache_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar2 = 0xf0;
  do {
    *(undefined8 *)((long)this + lVar2 + -8) = 0;
    *(undefined4 *)((long)&this->prog_ + lVar2) = 0xffffffff;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x170);
  pPVar1 = this->prog_;
  n = pPVar1->size_;
  maxmark = 0;
  if (this->kind_ == kLongestMatch) {
    maxmark = n;
  }
  len = pPVar1->inst_count_[6] + pPVar1->inst_count_[3] + maxmark + pPVar1->inst_count_[4] + 1;
  lVar2 = (max_mem - ((long)(n + maxmark) * 0x10 + (long)len * 4)) + -0x168;
  this->mem_budget_ = lVar2;
  if ((lVar2 < 0) ||
     (this->state_budget_ = lVar2,
     lVar2 < (((long)maxmark + (long)pPVar1->list_count_) * 4 + (long)pPVar1->bytemap_range_ * 8) *
             0x14 + 0x1e0)) {
    this->init_failed_ = true;
  }
  else {
    pWVar3 = (Workq *)operator_new(0x38);
    Workq::Workq(pWVar3,n,maxmark);
    this->q0_ = pWVar3;
    pWVar3 = (Workq *)operator_new(0x38);
    Workq::Workq(pWVar3,this->prog_->size_,maxmark);
    this->q1_ = pWVar3;
    PODArray<int>::PODArray((PODArray<int> *)&local_40,len);
    std::__uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>::operator=
              ((__uniq_ptr_impl<int,_re2::PODArray<int>::Deleter> *)&this->stack_,&local_40);
    std::unique_ptr<int[],_re2::PODArray<int>::Deleter>::~unique_ptr
              ((unique_ptr<int[],_re2::PODArray<int>::Deleter> *)&local_40);
  }
  return;
}

Assistant:

DFA::DFA(Prog* prog, Prog::MatchKind kind, int64_t max_mem)
  : prog_(prog),
    kind_(kind),
    init_failed_(false),
    q0_(NULL),
    q1_(NULL),
    mem_budget_(max_mem) {
  if (ExtraDebug)
    fprintf(stderr, "\nkind %d\n%s\n", (int)kind_, prog_->DumpUnanchored().c_str());
  int nmark = 0;
  if (kind_ == Prog::kLongestMatch)
    nmark = prog_->size();
  // See DFA::AddToQueue() for why this is so.
  int nstack = prog_->inst_count(kInstCapture) +
               prog_->inst_count(kInstEmptyWidth) +
               prog_->inst_count(kInstNop) +
               nmark + 1;  // + 1 for start inst

  // Account for space needed for DFA, q0, q1, stack.
  mem_budget_ -= sizeof(DFA);
  mem_budget_ -= (prog_->size() + nmark) *
                 (sizeof(int)+sizeof(int)) * 2;  // q0, q1
  mem_budget_ -= nstack * sizeof(int);  // stack
  if (mem_budget_ < 0) {
    init_failed_ = true;
    return;
  }

  state_budget_ = mem_budget_;

  // Make sure there is a reasonable amount of working room left.
  // At minimum, the search requires room for two states in order
  // to limp along, restarting frequently.  We'll get better performance
  // if there is room for a larger number of states, say 20.
  // Note that a state stores list heads only, so we use the program
  // list count for the upper bound, not the program size.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int64_t one_state = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
                      (prog_->list_count()+nmark)*sizeof(int);
  if (state_budget_ < 20*one_state) {
    init_failed_ = true;
    return;
  }

  q0_ = new Workq(prog_->size(), nmark);
  q1_ = new Workq(prog_->size(), nmark);
  stack_ = PODArray<int>(nstack);
}